

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall
bloom_tests::bloom_create_insert_serialize_with_tweak::test_method
          (bloom_create_insert_serialize_with_tweak *this)

{
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  Span<const_unsigned_char> vKey_02;
  Span<const_unsigned_char> vKey_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *this_00;
  iterator left_begin;
  iterator left_end;
  long in_FS_OFFSET;
  DataStream stream;
  CBloomFilter filter;
  array<std::byte,_13UL> expected;
  CBloomFilter *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  CBloomFilter *in_stack_fffffffffffffb80;
  const_string *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  lazy_ostream *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  double in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  CBloomFilter *in_stack_fffffffffffffbc8;
  byte *right_end;
  undefined7 in_stack_fffffffffffffc20;
  assertion_result local_340 [2];
  undefined8 local_308;
  const_string local_2e0;
  lazy_ostream local_2d0 [3];
  assertion_result local_2a0 [3];
  const_string local_258;
  lazy_ostream local_248 [3];
  assertion_result local_218 [3];
  const_string local_1d0;
  lazy_ostream local_1c0 [3];
  assertion_result local_190 [2];
  const_string local_158;
  lazy_ostream local_148 [3];
  assertion_result local_118 [4];
  undefined8 local_a1;
  undefined4 local_99;
  undefined1 local_95;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffffbc8,(uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
             in_stack_fffffffffffffbb8,(uint)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffffbb0 >> 0x18));
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  vKey.m_size = in_stack_fffffffffffffb98;
  vKey.m_data = (uchar *)in_stack_fffffffffffffb90;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffb78,vKey);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    vKey_02.m_data._7_1_ = in_stack_fffffffffffffba7;
    vKey_02.m_data._0_7_ = in_stack_fffffffffffffba0;
    vKey_02.m_size = (size_t)in_stack_fffffffffffffba8;
    CBloomFilter::contains(in_stack_fffffffffffffb80,vKey_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,
               SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb70,(char (*) [51])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_118,local_148,&local_158,0x42,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                        *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___25,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    vKey_03.m_data._7_1_ = in_stack_fffffffffffffba7;
    vKey_03.m_data._0_7_ = in_stack_fffffffffffffba0;
    vKey_03.m_size = (size_t)in_stack_fffffffffffffba8;
    CBloomFilter::contains(in_stack_fffffffffffffb80,vKey_03);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,
               SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
    this_00 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb70,(char (*) [46])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_190,local_1c0,&local_1d0,0x44,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>
                        *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___181,_162,_199,_134,_217,_239,_70,_88,_40,_124,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  vKey_00.m_size = in_stack_fffffffffffffb98;
  vKey_00.m_data = (uchar *)in_stack_fffffffffffffb90;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffb78,vKey_00);
  do {
    right_end = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___181,_162,_199,_134,_217,_239,_70,_88,_40,_124,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    vKey_04.m_data._7_1_ = in_stack_fffffffffffffba7;
    vKey_04.m_data._0_7_ = in_stack_fffffffffffffba0;
    vKey_04.m_size = (size_t)in_stack_fffffffffffffba8;
    CBloomFilter::contains(in_stack_fffffffffffffb80,vKey_04);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,
               SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb70,(char (*) [55])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_218,local_248,&local_258,0x47,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>
                        *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___185,_48,_6,_112,_180,_197,_54,_110,_149,_178,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  vKey_01.m_size = in_stack_fffffffffffffb98;
  vKey_01.m_data = (uchar *)in_stack_fffffffffffffb90;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffb78,vKey_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___185,_48,_6,_112,_180,_197,_54,_110,_149,_178,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    vKey_05.m_data._7_1_ = in_stack_fffffffffffffba7;
    vKey_05.m_data._0_7_ = in_stack_fffffffffffffba0;
    vKey_05.m_size = (size_t)in_stack_fffffffffffffba8;
    CBloomFilter::contains(in_stack_fffffffffffffb80,vKey_05);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,
               SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb70,(char (*) [55])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_2a0,local_2d0,&local_2e0,0x4a,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>
                        *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_308 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffb68);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffb78,(CBloomFilter *)in_stack_fffffffffffffb70);
  local_a1 = 0x59942ce03;
  local_99 = 0x80000001;
  local_95 = 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    left_begin = DataStream::begin((DataStream *)in_stack_fffffffffffffb78);
    left_end = DataStream::end((DataStream *)in_stack_fffffffffffffb70);
    std::array<std::byte,_13UL>::begin((array<std::byte,_13UL> *)in_stack_fffffffffffffb68);
    std::array<std::byte,_13UL>::end((array<std::byte,_13UL> *)in_stack_fffffffffffffb68);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)this_00,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )left_begin._M_current,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )left_end._M_current,(byte *)CONCAT17(uVar2,in_stack_fffffffffffffc20),right_end);
    in_stack_fffffffffffffba8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb70,(char (*) [1])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb78 = "stream.end()";
    in_stack_fffffffffffffb70 = "stream.begin()";
    in_stack_fffffffffffffb68 = (CBloomFilter *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_340,(lazy_ostream *)&stack0xfffffffffffffc98,
               (const_string *)&stack0xfffffffffffffc88,0x50,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffba7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffba7);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffb68);
  CBloomFilter::~CBloomFilter(in_stack_fffffffffffffb68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_serialize_with_tweak)
{
    // Same test as bloom_create_insert_serialize, but we add a nTweak of 100
    CBloomFilter filter(3, 0.01, 2147483649UL, BLOOM_UPDATE_ALL);

    filter.insert("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8);
    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
    // One bit different in first byte
    BOOST_CHECK_MESSAGE(!filter.contains("19108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter contains something it shouldn't!");

    filter.insert("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8), "Bloom filter doesn't contain just-inserted object (2)!");

    filter.insert("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8), "Bloom filter doesn't contain just-inserted object (3)!");

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"03ce4299050000000100008001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());
}